

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D2xNvmFlash.cpp
# Opt level: O0

void __thiscall D2xNvmFlash::erase(D2xNvmFlash *this,uint32_t offset,uint32_t size)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  FlashEraseError *pFVar4;
  uint32_t wordAddr;
  uint16_t statusReg;
  uint32_t eraseNum;
  uint32_t eraseEnd;
  uint32_t eraseSize;
  uint32_t size_local;
  uint32_t offset_local;
  D2xNvmFlash *this_local;
  
  uVar1 = (this->super_Flash)._size * 4;
  if (offset % uVar1 != 0) {
    pFVar4 = (FlashEraseError *)__cxa_allocate_exception(8);
    FlashEraseError::FlashEraseError(pFVar4);
    __cxa_throw(pFVar4,&FlashEraseError::typeinfo,FlashEraseError::~FlashEraseError);
  }
  uVar2 = (*(this->super_Flash)._vptr_Flash[6])();
  if (uVar2 < offset + size) {
    pFVar4 = (FlashEraseError *)__cxa_allocate_exception(8);
    FlashEraseError::FlashEraseError(pFVar4);
    __cxa_throw(pFVar4,&FlashEraseError::typeinfo,FlashEraseError::~FlashEraseError);
  }
  for (wordAddr = offset / uVar1; wordAddr < ((offset + size + uVar1) - 1) / uVar1;
      wordAddr = wordAddr + 1) {
    waitReady(this);
    uVar3 = readReg(this,'\x18');
    writeReg(this,'\x18',uVar3 & 0xffff | 0xffeb);
    writeReg(this,'\x1c',wordAddr * uVar1 >> 1);
    command(this,'\x02');
  }
  return;
}

Assistant:

void
D2xNvmFlash::erase(uint32_t offset, uint32_t size)
{
    uint32_t eraseSize = _size * ERASE_ROW_PAGES;

    // Offset must be a multiple of the erase size
    if (offset % eraseSize)
        throw FlashEraseError();

    // Offset and size must be in range
    if (offset + size > totalSize())
        throw FlashEraseError();

    uint32_t eraseEnd = (offset + size + eraseSize - 1) / eraseSize;

    // Erase each erase size set of pages
    for (uint32_t eraseNum = offset / eraseSize; eraseNum < eraseEnd; eraseNum++)
    {
        waitReady();

        // Clear error bits
        uint16_t statusReg = readReg(NVM_REG_STATUS);
        writeReg(NVM_REG_STATUS, statusReg | NVM_CTRL_STATUS_MASK);

        // Issue erase command
        uint32_t wordAddr = (eraseNum * eraseSize) / 2;
        writeReg(NVM_REG_ADDR, wordAddr);
        command(NVM_CMD_ER);
    }
}